

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_flac_oggbs__goto_next_page
                    (ma_dr_flac_oggbs *oggbs,ma_dr_flac_ogg_crc_mismatch_recovery recoveryMethod)

{
  bool bVar1;
  ma_result mVar2;
  ma_bool32 mVar3;
  size_t sVar4;
  ulong uVar5;
  ma_uint64 mVar6;
  ma_uint32 mVar7;
  ma_bool32 unaff_R12D;
  ma_bool32 mVar8;
  uint uVar9;
  ma_uint64 offset;
  ma_uint32 crc32;
  ma_uint32 bytesRead;
  ma_dr_flac_ogg_page_header header;
  ma_uint32 local_164;
  ma_dr_flac_ogg_crc_mismatch_recovery local_160;
  uint local_15c;
  ma_dr_flac_ogg_page_header *local_158;
  ma_dr_flac_ogg_page_header local_150;
  
  local_158 = &oggbs->currentPageHeader;
  local_160 = recoveryMethod;
  do {
    local_164 = 0;
    mVar2 = ma_dr_flac_ogg__read_page_header
                      (oggbs->onRead,oggbs->pUserData,&local_150,&local_15c,&local_164);
    bVar1 = false;
    mVar8 = 0;
    if (mVar2 == MA_SUCCESS) {
      oggbs->currentBytePos = oggbs->currentBytePos + (ulong)local_15c;
      if ((ulong)local_150.segmentCount == 0) {
        offset = 0;
      }
      else {
        uVar5 = 0;
        offset = 0;
        do {
          offset = (ma_uint64)((int)offset + (uint)local_150.segmentTable[uVar5]);
          uVar5 = uVar5 + 1;
        } while (local_150.segmentCount != uVar5);
      }
      bVar1 = true;
      uVar9 = (uint)offset;
      mVar8 = unaff_R12D;
      if (uVar9 < 0xff1c) {
        if (local_150.serialNumber == oggbs->serialNumber) {
          sVar4 = (*oggbs->onRead)(oggbs->pUserData,oggbs->pageData,offset);
          oggbs->currentBytePos = oggbs->currentBytePos + sVar4;
          bVar1 = false;
          mVar8 = 0;
          if (sVar4 == offset) {
            oggbs->pageDataSize = uVar9;
            mVar7 = local_164;
            if (uVar9 != 0) {
              mVar6 = 0;
              do {
                mVar7 = mVar7 << 8 ^
                        ma_dr_flac__crc32_table[mVar7 >> 0x18 ^ (uint)oggbs->pageData[mVar6]];
                mVar6 = mVar6 + 1;
              } while (offset != mVar6);
            }
            if (mVar7 == local_150.checksum) {
              memcpy(local_158,&local_150,0x120);
              oggbs->bytesRemainingInPage = uVar9;
              mVar8 = 1;
            }
            else {
              bVar1 = true;
              mVar8 = unaff_R12D;
              if (local_160 == ma_dr_flac_ogg_recover_on_crc_mismatch) goto LAB_00168c7e;
              mVar8 = 0;
              ma_dr_flac_oggbs__goto_next_page(oggbs,ma_dr_flac_ogg_recover_on_crc_mismatch);
            }
LAB_00168c7c:
            bVar1 = false;
          }
        }
        else {
          if ((uVar9 != 0) &&
             (mVar3 = ma_dr_flac_oggbs__seek_physical(oggbs,offset,ma_dr_flac_seek_origin_current),
             mVar3 == 0)) {
            mVar8 = 0;
            goto LAB_00168c7c;
          }
          bVar1 = true;
        }
      }
    }
LAB_00168c7e:
    unaff_R12D = mVar8;
    if (!bVar1) {
      return unaff_R12D;
    }
  } while( true );
}

Assistant:

static ma_bool32 ma_dr_flac_oggbs__goto_next_page(ma_dr_flac_oggbs* oggbs, ma_dr_flac_ogg_crc_mismatch_recovery recoveryMethod)
{
    ma_dr_flac_ogg_page_header header;
    for (;;) {
        ma_uint32 crc32 = 0;
        ma_uint32 bytesRead;
        ma_uint32 pageBodySize;
#ifndef MA_DR_FLAC_NO_CRC
        ma_uint32 actualCRC32;
#endif
        if (ma_dr_flac_ogg__read_page_header(oggbs->onRead, oggbs->pUserData, &header, &bytesRead, &crc32) != MA_SUCCESS) {
            return MA_FALSE;
        }
        oggbs->currentBytePos += bytesRead;
        pageBodySize = ma_dr_flac_ogg__get_page_body_size(&header);
        if (pageBodySize > MA_DR_FLAC_OGG_MAX_PAGE_SIZE) {
            continue;
        }
        if (header.serialNumber != oggbs->serialNumber) {
            if (pageBodySize > 0 && !ma_dr_flac_oggbs__seek_physical(oggbs, pageBodySize, ma_dr_flac_seek_origin_current)) {
                return MA_FALSE;
            }
            continue;
        }
        if (ma_dr_flac_oggbs__read_physical(oggbs, oggbs->pageData, pageBodySize) != pageBodySize) {
            return MA_FALSE;
        }
        oggbs->pageDataSize = pageBodySize;
#ifndef MA_DR_FLAC_NO_CRC
        actualCRC32 = ma_dr_flac_crc32_buffer(crc32, oggbs->pageData, oggbs->pageDataSize);
        if (actualCRC32 != header.checksum) {
            if (recoveryMethod == ma_dr_flac_ogg_recover_on_crc_mismatch) {
                continue;
            } else {
                ma_dr_flac_oggbs__goto_next_page(oggbs, ma_dr_flac_ogg_recover_on_crc_mismatch);
                return MA_FALSE;
            }
        }
#else
        (void)recoveryMethod;
#endif
        oggbs->currentPageHeader = header;
        oggbs->bytesRemainingInPage = pageBodySize;
        return MA_TRUE;
    }
}